

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<short>>
               (GetterYs<short> getter,TransformerLinLin transformer,ImDrawList *DrawList,
               ImPlotMarker marker,float size,bool rend_mk_line,ImU32 col_mk_line,float weight,
               bool rend_mk_fill,ImU32 col_mk_fill)

{
  ImPlotContext *pIVar1;
  bool bVar2;
  int i;
  int idx;
  TransformerLinLin local_5c;
  long local_58;
  ImDrawList *local_50;
  ImVec2 local_48;
  ImPlotPoint local_40;
  
  pIVar1 = GImPlot;
  local_58 = (long)marker;
  local_5c.YAxis = transformer.YAxis;
  local_50 = DrawList;
  for (idx = 0; idx < getter.Count; idx = idx + 1) {
    local_40 = GetterYs<short>::operator()(&getter,idx);
    local_48 = TransformerLinLin::operator()(&local_5c,&local_40);
    bVar2 = ImRect::Contains(&pIVar1->CurrentPlot->PlotRect,&local_48);
    if (bVar2) {
      (*RenderMarkers<ImPlot::TransformerLinLin,_ImPlot::GetterYs<short>_>::marker_table[local_58])
                (local_50,&local_48,size,rend_mk_line,col_mk_line,rend_mk_fill,col_mk_fill,weight);
    }
  }
  return;
}

Assistant:

inline void RenderMarkers(Getter getter, Transformer transformer, ImDrawList& DrawList, ImPlotMarker marker, float size, bool rend_mk_line, ImU32 col_mk_line, float weight, bool rend_mk_fill, ImU32 col_mk_fill) {
    static void (*marker_table[ImPlotMarker_COUNT])(ImDrawList&, const ImVec2&, float s, bool, ImU32, bool, ImU32, float) = {
        RenderMarkerCircle,
        RenderMarkerSquare,
        RenderMarkerDiamond ,
        RenderMarkerUp ,
        RenderMarkerDown ,
        RenderMarkerLeft,
        RenderMarkerRight,
        RenderMarkerCross,
        RenderMarkerPlus,
        RenderMarkerAsterisk
    };
    ImPlotContext& gp = *GImPlot;
    for (int i = 0; i < getter.Count; ++i) {
        ImVec2 c = transformer(getter(i));
        if (gp.CurrentPlot->PlotRect.Contains(c))
            marker_table[marker](DrawList, c, size, rend_mk_line, col_mk_line, rend_mk_fill, col_mk_fill, weight);
    }
}